

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_datablobsources.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 local_48;
  char *name;
  hrgls_APIDataBlobSourceInfo dbsInfo;
  uint32_t i;
  uint32_t count;
  hrgls_API api;
  hrgls_APICreateParams params;
  char **ppcStack_18;
  hrgls_Status status;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  params._4_4_ = hrgls_APICreateParametersCreate(&api);
  pFVar1 = _stderr;
  if (params._4_4_ == 0) {
    params._4_4_ = hrgls_APICreate(&i,api);
    pFVar1 = _stderr;
    if (params._4_4_ == 0) {
      params._4_4_ = hrgls_APICreateParametersDestroy(api);
      pFVar1 = _stderr;
      if (params._4_4_ == 0) {
        params._4_4_ = hrgls_APIGetAvailableDataBlobSourceCount(_i,(long)&dbsInfo + 4);
        pFVar1 = _stderr;
        if (params._4_4_ == 0) {
          printf("Found %d DataBlobSources\n",(ulong)dbsInfo._4_4_);
          for (dbsInfo._0_4_ = 0; (uint)dbsInfo < dbsInfo._4_4_; dbsInfo._0_4_ = (uint)dbsInfo + 1)
          {
            params._4_4_ = hrgls_APIGetAvailableDataBlobSourceInfo(_i,(uint)dbsInfo,&name);
            uVar2 = (uint)dbsInfo;
            pFVar1 = _stderr;
            if (params._4_4_ != 0) {
              uVar3 = hrgls_ErrorMessage(params._4_4_);
              fprintf(pFVar1,"Could not get DataBlobSource info for DataBlobSource %d: %s\n",
                      (ulong)uVar2,uVar3);
              return 0x12d;
            }
            params._4_4_ = hrgls_APIDataBlobSourceGetName(name,&local_48);
            uVar2 = (uint)dbsInfo;
            pFVar1 = _stderr;
            if (params._4_4_ != 0) {
              uVar3 = hrgls_ErrorMessage(params._4_4_);
              fprintf(pFVar1,"Could not get DataBlobSource name for DataBlobSource %d: %s\n",
                      (ulong)uVar2,uVar3);
              return 0x12e;
            }
            printf(" DataBlobSource name: %s\n",local_48);
          }
          params._4_4_ = hrgls_APIDestroy(_i);
          pFVar1 = _stderr;
          if (params._4_4_ == 0) {
            argv_local._4_4_ = 0;
          }
          else {
            uVar3 = hrgls_ErrorMessage(params._4_4_);
            fprintf(pFVar1,"Could not destroy API with default parameters: %s\n",uVar3);
            argv_local._4_4_ = 0x14;
          }
        }
        else {
          uVar3 = hrgls_ErrorMessage(params._4_4_);
          fprintf(pFVar1,"Could not get number of available DataBlobSources: %s\n",uVar3);
          argv_local._4_4_ = 3;
        }
      }
      else {
        uVar3 = hrgls_ErrorMessage(params._4_4_);
        fprintf(pFVar1,"Could not destroy API open parameters: %s\n",uVar3);
        argv_local._4_4_ = 1000;
      }
    }
    else {
      uVar3 = hrgls_ErrorMessage(params._4_4_);
      fprintf(pFVar1,"Could not create API with default parameters: %s\n",uVar3);
      argv_local._4_4_ = 2;
    }
  }
  else {
    uVar3 = hrgls_ErrorMessage(params._4_4_);
    fprintf(pFVar1,"Could not create API open parameters: %s\n",uVar3);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object, specifying default parameters.
  hrgls_Status status;
  hrgls_APICreateParams params;
  status = hrgls_APICreateParametersCreate(&params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1;
  }

  hrgls_API api;
  status = hrgls_APICreate(&api, params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 2;
  }
  status = hrgls_APICreateParametersDestroy(params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1000;
  }

  // Find out how many DataBlobSources are in the system, which will also latch the data
  // on the DataBlobSources.
  uint32_t count;
  if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceCount(api, &count))) {
    fprintf(stderr, "Could not get number of available DataBlobSources: %s\n",
      hrgls_ErrorMessage(status));
    return 3;
  }
  printf("Found %d DataBlobSources\n", count);

  // Read each DataBlobSource's information.
  for (uint32_t i = 0; i < count; i++) {
    hrgls_APIDataBlobSourceInfo dbsInfo;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceInfo(api, i, &dbsInfo))) {
      fprintf(stderr, "Could not get DataBlobSource info for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 301;
    }

    // Get and print the DataBlobSource name.
    const char *name;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIDataBlobSourceGetName(dbsInfo, &name))) {
      fprintf(stderr, "Could not get DataBlobSource name for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 302;
    }
    printf(" DataBlobSource name: %s\n", name);
  }

  status = hrgls_APIDestroy(api);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 20;
  }

  return 0;
}